

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O2

mpt_type_traits * mpt_type_traits(mpt_type_t type)

{
  generic_traits_chunk *pgVar1;
  mpt_type_traits *pmVar2;
  mpt_named_traits *pmVar3;
  long lVar4;
  size_t sVar5;
  generic_traits_chunk **ppgVar6;
  uint uVar7;
  ulong uVar8;
  
  if (type == 0) {
LAB_0011ab80:
    pmVar2 = (mpt_type_traits *)0x0;
  }
  else {
    if (type < 0x20) {
      if (core_types == (mpt_type_traits *)0x0) {
        pmVar2 = (mpt_type_traits *)calloc(0x18,0x20);
        core_types = pmVar2;
        for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
          pmVar2[core_sizes[lVar4].type].size = (ulong)core_sizes[lVar4].size;
        }
        atexit(_core_fini);
      }
      pmVar2 = core_types + type;
      sVar5 = core_types[type].size;
    }
    else {
      if (type - 0x60 < 0x1b) {
        if (scalar_types == (mpt_type_traits *)0x0) {
          pmVar2 = (mpt_type_traits *)calloc(0x18,0x20);
          scalar_types = pmVar2;
          for (lVar4 = 0; lVar4 != 0xd; lVar4 = lVar4 + 1) {
            pmVar2[(ulong)scalar_sizes[lVar4].type - 0x60].size = (ulong)scalar_sizes[lVar4].size;
          }
          atexit(_scalar_fini);
        }
        pmVar2 = scalar_types + (type - 0x60);
      }
      else {
        if (0x19 < type - 0x40) {
          if ((type & 0xffffffffffffffc0) == 0xc0) {
            uVar7 = (int)type - 0xc0;
            if (dynamic_pos <= (int)uVar7) {
              return (mpt_type_traits *)0x0;
            }
            return dynamic_types + uVar7;
          }
          if ((type & 0xffffffffffffffc0) == 0x80) {
            pmVar3 = mpt_interface_traits(type);
          }
          else {
            switch(type) {
            case 0x800:
              pmVar2 = mpt_identifier_traits();
              return pmVar2;
            case 0x801:
              pmVar2 = mpt_meta_reference_traits();
              return pmVar2;
            case 0x802:
              pmVar2 = mpt_array_traits();
              return pmVar2;
            case 0x803:
              pmVar2 = mpt_command_traits();
              return pmVar2;
            }
            if (0x6ff < type - 0x100) {
              uVar8 = type - 0x900;
              ppgVar6 = &generic_types;
              while( true ) {
                pgVar1 = *ppgVar6;
                if (pgVar1 == (generic_traits_chunk *)0x0) {
                  return (mpt_type_traits *)0x0;
                }
                if (uVar8 < pgVar1->used) break;
                uVar8 = uVar8 - 0x1e;
                ppgVar6 = &pgVar1->next;
              }
              return pgVar1->traits[uVar8];
            }
            pmVar3 = mpt_metatype_traits(type);
          }
          if (pmVar3 != (mpt_named_traits *)0x0) {
            return pmVar3->traits;
          }
          goto LAB_0011ab80;
        }
        if (iovec_types == (mpt_type_traits *)0x0) {
          pmVar2 = (mpt_type_traits *)calloc(0x18,0x20);
          iovec_types = pmVar2;
          for (lVar4 = 0; lVar4 != 0xd; lVar4 = lVar4 + 1) {
            pmVar2[(ulong)scalar_sizes[lVar4].type - 0x60].size = 0x10;
          }
          atexit(_iovec_fini);
        }
        pmVar2 = iovec_types + (type - 0x40);
      }
      sVar5 = pmVar2->size;
    }
    if (sVar5 == 0) {
      pmVar2 = (mpt_type_traits *)0x0;
    }
  }
  return pmVar2;
}

Assistant:

extern const MPT_STRUCT(type_traits) *mpt_type_traits(MPT_TYPE(type) type)
{
	const struct generic_traits_chunk *group;
	
	/* bad type value */
	if (!type) {
		return 0;
	}
	/* builtin scalar types */
	if (type < MPT_ENUM(_TypeCoreSize)) {
		if (!core_types) {
			_core_init();
		}
		return core_types[type].size ? &core_types[type] : 0;
	}
	/* generic/typed vector */
	if (MPT_type_isScalar(type)) {
		if (!scalar_types) {
			_scalar_init();
		}
		type -= MPT_ENUM(_TypeScalarBase);
		return scalar_types[type].size ? &scalar_types[type] : 0;
	}
	/* generic/typed vector */
	if (MPT_type_isVector(type)) {
		if (!iovec_types) {
			_iovec_init();
		}
		type -= MPT_ENUM(_TypeVectorBase);
		return iovec_types[type].size ? &iovec_types[type] : 0;
	}
	/* interface type */
	if (MPT_type_isInterface(type)) {
		const MPT_STRUCT(named_traits) *it = mpt_interface_traits(type);
		return it ? it->traits : 0;
	}
	
	if (MPT_type_isDynamic(type)) {
		int pos = type - MPT_ENUM(_TypeDynamicBase);
		if (pos >= dynamic_pos) {
			return 0;
		}
		return dynamic_types + pos;
	}
	
	switch (type) {
		case MPT_ENUM(TypeIdentifier):
			return mpt_identifier_traits();
		case MPT_ENUM(TypeArray):
			return mpt_array_traits();
		case MPT_ENUM(TypeMetaRef):
			return mpt_meta_reference_traits();
		case MPT_ENUM(TypeCommand):
			return mpt_command_traits();
		default:;
	}
	
	if (MPT_type_isMetaPtr(type)) {
		const MPT_STRUCT(named_traits) *it = mpt_metatype_traits(type);
		return it ? it->traits : 0;
	}
	
	type -= MPT_ENUM(_TypeValueAdd);
	group = generic_types;
	while (group) {
		if (type < group->used) {
			return group->traits[type];
		}
		type -= MPT_arrsize(group->traits);
		group = group->next;
	}
	
	return 0;
}